

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assign.h
# Opt level: O0

void Eigen::internal::
     assign_impl<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>,_3,_0,_0>
     ::run(Matrix<int,__1,_1,_0,__1,_1> *dst,
          CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
          *src)

{
  Index end;
  long start;
  undefined8 local_38;
  Index index;
  Index alignedEnd;
  Index alignedStart;
  Index size;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
  *src_local;
  Matrix<int,__1,_1,_0,__1,_1> *dst_local;
  
  end = EigenBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::size
                  ((EigenBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)dst);
  start = end / 4 << 2;
  unaligned_assign_impl<true>::
  run<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,Eigen::Matrix<int,_1,1,0,_1,1>>,Eigen::Matrix<int,_1,1,0,_1,1>>
            (src,dst,0,0);
  for (local_38 = 0; local_38 < start; local_38 = local_38 + 4) {
    DenseCoeffsBase<Eigen::Matrix<int,-1,1,0,-1,1>,1>::
    copyPacket<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,Eigen::Matrix<int,_1,1,0,_1,1>>,1,0>
              ((DenseCoeffsBase<Eigen::Matrix<int,_1,1,0,_1,1>,1> *)dst,local_38,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                *)src);
  }
  unaligned_assign_impl<false>::
  run<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,Eigen::Matrix<int,_1,1,0,_1,1>>,Eigen::Matrix<int,_1,1,0,_1,1>>
            (src,dst,start,end);
  return;
}

Assistant:

static EIGEN_STRONG_INLINE void run(Derived1 &dst, const Derived2 &src)
  {
    const Index size = dst.size();
    typedef packet_traits<typename Derived1::Scalar> PacketTraits;
    enum {
      packetSize = PacketTraits::size,
      dstAlignment = PacketTraits::AlignedOnScalar ? Aligned : int(assign_traits<Derived1,Derived2>::DstIsAligned) ,
      srcAlignment = assign_traits<Derived1,Derived2>::JointAlignment
    };
    const Index alignedStart = assign_traits<Derived1,Derived2>::DstIsAligned ? 0
                             : internal::first_aligned(&dst.coeffRef(0), size);
    const Index alignedEnd = alignedStart + ((size-alignedStart)/packetSize)*packetSize;

    unaligned_assign_impl<assign_traits<Derived1,Derived2>::DstIsAligned!=0>::run(src,dst,0,alignedStart);

    for(Index index = alignedStart; index < alignedEnd; index += packetSize)
    {
      dst.template copyPacket<Derived2, dstAlignment, srcAlignment>(index, src);
    }

    unaligned_assign_impl<>::run(src,dst,alignedEnd,size);
  }